

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,ReturnNode *node)

{
  ExpressionNode *pEVar1;
  pointer pVVar2;
  unique_ptr<Value,_std::default_delete<Value>_> *in_RDI;
  unique_ptr<Value,_std::default_delete<Value>_> returnedValue;
  stack<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>_>
  *this_00;
  
  pEVar1 = ReturnNode::getValue((ReturnNode *)0x15ca21);
  (*(pEVar1->super_Node)._vptr_Node[2])(pEVar1,in_RDI);
  pVVar2 = std::unique_ptr<Value,_std::default_delete<Value>_>::operator->
                     ((unique_ptr<Value,_std::default_delete<Value>_> *)0x15ca3e);
  this_00 = (stack<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::deque<std::unique_ptr<Value,_std::default_delete<Value>_>,_std::allocator<std::unique_ptr<Value,_std::default_delete<Value>_>_>_>_>
             *)&stack0xffffffffffffffe8;
  (*pVVar2->_vptr_Value[2])();
  std::
  stack<std::unique_ptr<Value,std::default_delete<Value>>,std::deque<std::unique_ptr<Value,std::default_delete<Value>>,std::allocator<std::unique_ptr<Value,std::default_delete<Value>>>>>
  ::emplace<std::unique_ptr<Value,std::default_delete<Value>>>(this_00,in_RDI);
  std::unique_ptr<Value,_std::default_delete<Value>_>::~unique_ptr
            ((unique_ptr<Value,_std::default_delete<Value>_> *)this_00);
  return;
}

Assistant:

void Executor::visit(const ReturnNode& node)
{
  node.getValue().accept(*this);
  auto returnedValue = value_->clone();
  returnStack_.emplace(std::move(returnedValue));
}